

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O3

type __thiscall
llvm::make_unique<llbuild::buildsystem::StatNode,llvm::StringRef>(llvm *this,StringRef *args)

{
  char *pcVar1;
  size_t sVar2;
  string *psVar3;
  
  psVar3 = (string *)operator_new(0x20);
  pcVar1 = args->Data;
  sVar2 = args->Length;
  *(string **)psVar3 = psVar3 + 0x10;
  if (pcVar1 == (char *)0x0) {
    *(undefined8 *)(psVar3 + 8) = 0;
    psVar3[0x10] = (string)0x0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>(psVar3,pcVar1,pcVar1 + sVar2);
  }
  *(string **)this = psVar3;
  return (__uniq_ptr_data<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}